

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O3

void __thiscall ResourcePack::load_mesh(ResourcePack *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  string terr;
  string warn;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string mesh_file_path;
  Mesh mesh;
  attrib_t attrib;
  ostringstream mesh_file_path_stream;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&mesh_file_path_stream);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&mesh_file_path_stream,"../res/",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&mesh_file_path_stream,(name->_M_dataplus)._M_p,
                      name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".obj",4);
  std::__cxx11::stringbuf::str();
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  terr._M_string_length = 0;
  terr.field_2._M_local_buf[0] = '\0';
  terr._M_dataplus._M_p = (pointer)&terr.field_2;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  bVar1 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&terr,mesh_file_path._M_dataplus._M_p,
                           (char *)0x0,true,true);
  if (warn._M_string_length != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,warn._M_dataplus._M_p,warn._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (terr._M_string_length != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,terr._M_dataplus._M_p,terr._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (bVar1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    Mesh::Mesh(&mesh,&attrib.vertices,&attrib.normals,&attrib.texcoords,&attrib.colors);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
              ::operator[](&this->meshes,name);
    std::vector<float,_std::allocator<float>_>::operator=(&this_00->vertices,&mesh.vertices);
    std::vector<float,_std::allocator<float>_>::operator=(&this_00->normals,&mesh.normals);
    std::vector<float,_std::allocator<float>_>::operator=(&this_00->texcoords,&mesh.texcoords);
    std::vector<float,_std::allocator<float>_>::operator=(&this_00->colors,&mesh.colors);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mesh loaded",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    if (mesh.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(mesh.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (mesh.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(mesh.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (mesh.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(mesh.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (mesh.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(mesh.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)terr._M_dataplus._M_p != &terr.field_2) {
      operator_delete(terr._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)warn._M_dataplus._M_p != &warn.field_2) {
      operator_delete(warn._M_dataplus._M_p);
    }
    std::vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>::~vector(&materials);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
    if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)mesh_file_path._M_dataplus._M_p != &mesh_file_path.field_2) {
      operator_delete(mesh_file_path._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mesh_file_path_stream);
    std::ios_base::~ios_base(local_138);
    return;
  }
  exit(1);
}

Assistant:

void ResourcePack::load_mesh(std::string& name) {
    std::ostringstream mesh_file_path_stream;
    mesh_file_path_stream << "../res/" << name << ".obj";
    std::string mesh_file_path = mesh_file_path_stream.str();
 
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string terr;

    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &terr, mesh_file_path.c_str());

    if (!warn.empty()) {
        std::cout << warn << std::endl;
    }

    if (!terr.empty()) {
        std::cerr << terr << std::endl;
    }

    if (!ret) {
        exit(1);
    }

    std::cout << attrib.vertices.size() << std::endl;
    Mesh mesh(attrib.vertices, attrib.normals, attrib.texcoords, attrib.colors);
    meshes[name] = mesh;

    std::cout << "mesh loaded" << std::endl;
}